

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_object.cpp
# Opt level: O3

global_object_create_result *
mjs::make_function_object
          (global_object_create_result *__return_storage_ptr__,
          gc_heap_ptr<mjs::global_object> *global)

{
  gc_heap *this;
  bool bVar1;
  long *plVar2;
  function_object *pfVar3;
  void *pvVar4;
  gc_heap_ptr<mjs::function_object> o;
  gc_heap_ptr<mjs::function_object> obj;
  gc_heap_ptr<mjs::gc_function> p;
  object_ptr prototype;
  gc_heap_ptr_untyped local_e8;
  gc_heap_ptr_untyped local_d8;
  gc_heap_ptr_untyped local_c8;
  undefined1 local_b8 [16];
  undefined1 local_a8 [40];
  string_view local_80;
  gc_heap_ptr_untyped local_70;
  gc_heap_ptr_untyped local_60;
  gc_heap_ptr_untyped local_50;
  string_view local_40;
  
  plVar2 = (long *)gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
  (**(code **)(*plVar2 + 0x60))(&local_50,plVar2);
  bVar1 = gc_heap_ptr_untyped::has_type<mjs::function_object>(&local_50);
  if (bVar1) {
    pfVar3 = (function_object *)gc_heap_ptr_untyped::get(&local_50);
    local_70.heap_ = (gc_heap *)0x0;
    local_70.pos_ = 0;
    local_b8._0_8_ = (gc_heap *)0x0;
    local_b8._8_4_ = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)local_a8,(size_t)(pfVar3->super_native_object).super_object.heap_);
    pvVar4 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_a8);
    *(undefined ***)((long)pvVar4 + 8) = &PTR_destroy_001d8af8;
    function_object::put_function
              (pfVar3,(gc_heap_ptr<mjs::gc_function> *)local_a8,
               (gc_heap_ptr<mjs::gc_string> *)&local_70,(gc_heap_ptr<mjs::gc_string> *)local_b8,0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_a8);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_b8);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_70);
    local_70.heap_ = (global->super_gc_heap_ptr_untyped).heap_;
    local_70.pos_ = (global->super_gc_heap_ptr_untyped).pos_;
    if (local_70.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_70.heap_,&local_70);
    }
    local_60.heap_ = local_50.heap_;
    local_60.pos_ = local_50.pos_;
    if ((slot *)local_50.heap_ != (slot *)0x0) {
      gc_heap::attach(local_50.heap_,&local_60);
    }
    local_80._M_len = 8;
    local_80._M_str = "toString";
    string::string((string *)&local_40,(global->super_gc_heap_ptr_untyped).heap_,&local_80);
    plVar2 = (long *)gc_heap_ptr_untyped::get(&local_50);
    make_raw_function((mjs *)&local_c8,global);
    pfVar3 = (function_object *)gc_heap_ptr_untyped::get(&local_c8);
    local_d8.heap_ = (gc_heap *)0x0;
    local_d8.pos_ = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)local_b8,(size_t)(pfVar3->super_native_object).super_object.heap_);
    pvVar4 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_b8);
    *(undefined ***)((long)pvVar4 + 8) = &PTR_destroy_001d8b38;
    *(gc_heap **)((long)pvVar4 + 0x10) = local_70.heap_;
    *(uint32_t *)((long)pvVar4 + 0x18) = local_70.pos_;
    if (local_70.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_70.heap_,(gc_heap_ptr_untyped *)((long)pvVar4 + 0x10));
    }
    *(gc_heap **)((long)pvVar4 + 0x20) = local_60.heap_;
    *(uint32_t *)((long)pvVar4 + 0x28) = local_60.pos_;
    if ((slot *)local_60.heap_ != (slot *)0x0) {
      gc_heap::attach(local_60.heap_,(gc_heap_ptr_untyped *)((long)pvVar4 + 0x20));
    }
    function_object::put_function
              (pfVar3,(gc_heap_ptr<mjs::gc_function> *)local_b8,
               (gc_heap_ptr<mjs::gc_string> *)&local_40,(gc_heap_ptr<mjs::gc_string> *)&local_d8,0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_b8);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_d8);
    local_e8.heap_ = local_c8.heap_;
    local_e8.pos_ = local_c8.pos_;
    if (local_c8.heap_ == (gc_heap *)0x0) {
      local_a8._0_4_ = object;
      local_a8._8_8_ = (gc_heap *)0x0;
      local_a8._16_4_ = local_c8.pos_;
    }
    else {
      gc_heap::attach(local_c8.heap_,&local_e8);
      local_a8._0_4_ = object;
      local_a8._8_8_ = local_e8.heap_;
      local_a8._16_4_ = local_e8.pos_;
      if (local_e8.heap_ != (gc_heap *)0x0) {
        gc_heap::attach(local_e8.heap_,(gc_heap_ptr_untyped *)(local_a8 + 8));
      }
    }
    (**(code **)(*plVar2 + 8))(plVar2,&local_40,local_a8,2);
    value::destroy((value *)local_a8);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_e8);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_c8);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_40);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_60);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_70);
    pvVar4 = gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
    if (0 < *(int *)((long)pvVar4 + 0x20)) {
      local_80._M_len = (size_t)(global->super_gc_heap_ptr_untyped).heap_;
      local_80._M_str =
           (char *)CONCAT44(local_80._M_str._4_4_,(global->super_gc_heap_ptr_untyped).pos_);
      gc_heap::attach((gc_heap *)local_80._M_len,(gc_heap_ptr_untyped *)&local_80);
      local_40._M_len = 4;
      local_40._M_str = "call";
      string::string((string *)&local_c8,(global->super_gc_heap_ptr_untyped).heap_,&local_40);
      plVar2 = (long *)gc_heap_ptr_untyped::get(&local_50);
      make_raw_function((mjs *)&local_e8,global);
      pfVar3 = (function_object *)gc_heap_ptr_untyped::get(&local_e8);
      local_b8._0_8_ = (gc_heap *)0x0;
      local_b8._8_4_ = 0;
      gc_heap::allocate_and_construct<mjs::gc_function>
                ((gc_heap *)&local_70,(size_t)(pfVar3->super_native_object).super_object.heap_);
      pvVar4 = gc_heap_ptr_untyped::get(&local_70);
      *(undefined ***)((long)pvVar4 + 8) = &PTR_destroy_001d8b78;
      *(size_t *)((long)pvVar4 + 0x10) = local_80._M_len;
      *(uint32_t *)((long)pvVar4 + 0x18) = (uint32_t)local_80._M_str;
      if ((gc_heap *)local_80._M_len != (gc_heap *)0x0) {
        gc_heap::attach((gc_heap *)local_80._M_len,(gc_heap_ptr_untyped *)((long)pvVar4 + 0x10));
      }
      function_object::put_function
                (pfVar3,(gc_heap_ptr<mjs::gc_function> *)&local_70,
                 (gc_heap_ptr<mjs::gc_string> *)&local_c8,(gc_heap_ptr<mjs::gc_string> *)local_b8,1)
      ;
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_70);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_b8);
      local_d8.heap_ = local_e8.heap_;
      local_d8.pos_ = local_e8.pos_;
      if (local_e8.heap_ == (gc_heap *)0x0) {
        local_a8._0_4_ = object;
        local_a8._8_8_ = (gc_heap *)0x0;
        local_a8._16_4_ = local_e8.pos_;
      }
      else {
        gc_heap::attach(local_e8.heap_,&local_d8);
        local_a8._0_4_ = object;
        local_a8._8_8_ = local_d8.heap_;
        local_a8._16_4_ = local_d8.pos_;
        if (local_d8.heap_ != (gc_heap *)0x0) {
          gc_heap::attach(local_d8.heap_,(gc_heap_ptr_untyped *)(local_a8 + 8));
        }
      }
      (**(code **)(*plVar2 + 8))(plVar2,&local_c8,local_a8,2);
      value::destroy((value *)local_a8);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_d8);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_e8);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_c8);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_80);
      local_80._M_len = (size_t)(global->super_gc_heap_ptr_untyped).heap_;
      local_80._M_str =
           (char *)CONCAT44(local_80._M_str._4_4_,(global->super_gc_heap_ptr_untyped).pos_);
      gc_heap::attach((gc_heap *)local_80._M_len,(gc_heap_ptr_untyped *)&local_80);
      local_40._M_len = 5;
      local_40._M_str = "apply";
      string::string((string *)&local_c8,(global->super_gc_heap_ptr_untyped).heap_,&local_40);
      plVar2 = (long *)gc_heap_ptr_untyped::get(&local_50);
      make_raw_function((mjs *)&local_e8,global);
      pfVar3 = (function_object *)gc_heap_ptr_untyped::get(&local_e8);
      local_b8._0_8_ = (gc_heap *)0x0;
      local_b8._8_4_ = 0;
      gc_heap::allocate_and_construct<mjs::gc_function>
                ((gc_heap *)&local_70,(size_t)(pfVar3->super_native_object).super_object.heap_);
      pvVar4 = gc_heap_ptr_untyped::get(&local_70);
      *(undefined ***)((long)pvVar4 + 8) = &PTR_destroy_001d8bb8;
      *(size_t *)((long)pvVar4 + 0x10) = local_80._M_len;
      *(uint32_t *)((long)pvVar4 + 0x18) = (uint32_t)local_80._M_str;
      if ((gc_heap *)local_80._M_len != (gc_heap *)0x0) {
        gc_heap::attach((gc_heap *)local_80._M_len,(gc_heap_ptr_untyped *)((long)pvVar4 + 0x10));
      }
      function_object::put_function
                (pfVar3,(gc_heap_ptr<mjs::gc_function> *)&local_70,
                 (gc_heap_ptr<mjs::gc_string> *)&local_c8,(gc_heap_ptr<mjs::gc_string> *)local_b8,2)
      ;
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_70);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_b8);
      local_d8.heap_ = local_e8.heap_;
      local_d8.pos_ = local_e8.pos_;
      if (local_e8.heap_ == (gc_heap *)0x0) {
        local_a8._0_4_ = object;
        local_a8._8_8_ = (gc_heap *)0x0;
        local_a8._16_4_ = local_e8.pos_;
      }
      else {
        gc_heap::attach(local_e8.heap_,&local_d8);
        local_a8._0_4_ = object;
        local_a8._8_8_ = local_d8.heap_;
        local_a8._16_4_ = local_d8.pos_;
        if (local_d8.heap_ != (gc_heap *)0x0) {
          gc_heap::attach(local_d8.heap_,(gc_heap_ptr_untyped *)(local_a8 + 8));
        }
      }
      (**(code **)(*plVar2 + 8))(plVar2,&local_c8,local_a8,2);
      value::destroy((value *)local_a8);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_d8);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_e8);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_c8);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_80);
    }
    pvVar4 = gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
    if (1 < *(int *)((long)pvVar4 + 0x20)) {
      local_80._M_len = (size_t)(global->super_gc_heap_ptr_untyped).heap_;
      local_80._M_str =
           (char *)CONCAT44(local_80._M_str._4_4_,(global->super_gc_heap_ptr_untyped).pos_);
      gc_heap::attach((gc_heap *)local_80._M_len,(gc_heap_ptr_untyped *)&local_80);
      local_40._M_len = 4;
      local_40._M_str = "bind";
      string::string((string *)&local_c8,(global->super_gc_heap_ptr_untyped).heap_,&local_40);
      plVar2 = (long *)gc_heap_ptr_untyped::get(&local_50);
      make_raw_function((mjs *)&local_e8,global);
      pfVar3 = (function_object *)gc_heap_ptr_untyped::get(&local_e8);
      local_b8._0_8_ = (gc_heap *)0x0;
      local_b8._8_4_ = 0;
      gc_heap::allocate_and_construct<mjs::gc_function>
                ((gc_heap *)&local_70,(size_t)(pfVar3->super_native_object).super_object.heap_);
      pvVar4 = gc_heap_ptr_untyped::get(&local_70);
      *(undefined ***)((long)pvVar4 + 8) = &PTR_destroy_001d8bf8;
      *(size_t *)((long)pvVar4 + 0x10) = local_80._M_len;
      *(uint32_t *)((long)pvVar4 + 0x18) = (uint32_t)local_80._M_str;
      if ((gc_heap *)local_80._M_len != (gc_heap *)0x0) {
        gc_heap::attach((gc_heap *)local_80._M_len,(gc_heap_ptr_untyped *)((long)pvVar4 + 0x10));
      }
      function_object::put_function
                (pfVar3,(gc_heap_ptr<mjs::gc_function> *)&local_70,
                 (gc_heap_ptr<mjs::gc_string> *)&local_c8,(gc_heap_ptr<mjs::gc_string> *)local_b8,1)
      ;
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_70);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_b8);
      local_d8.heap_ = local_e8.heap_;
      local_d8.pos_ = local_e8.pos_;
      if (local_e8.heap_ == (gc_heap *)0x0) {
        local_a8._0_4_ = object;
        local_a8._8_8_ = (gc_heap *)0x0;
        local_a8._16_4_ = local_e8.pos_;
      }
      else {
        gc_heap::attach(local_e8.heap_,&local_d8);
        local_a8._0_4_ = object;
        local_a8._8_8_ = local_d8.heap_;
        local_a8._16_4_ = local_d8.pos_;
        if (local_d8.heap_ != (gc_heap *)0x0) {
          gc_heap::attach(local_d8.heap_,(gc_heap_ptr_untyped *)(local_a8 + 8));
        }
      }
      (**(code **)(*plVar2 + 8))(plVar2,&local_c8,local_a8,2);
      value::destroy((value *)local_a8);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_d8);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_e8);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_c8);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_80);
    }
    make_raw_function((mjs *)local_a8,global);
    this = (gc_heap *)CONCAT44(local_a8._4_4_,local_a8._0_4_);
    (__return_storage_ptr__->obj).super_gc_heap_ptr_untyped.heap_ = this;
    (__return_storage_ptr__->obj).super_gc_heap_ptr_untyped.pos_ = local_a8._8_4_;
    if (this != (gc_heap *)0x0) {
      gc_heap::attach(this,(gc_heap_ptr_untyped *)__return_storage_ptr__);
    }
    (__return_storage_ptr__->prototype).super_gc_heap_ptr_untyped.heap_ = local_50.heap_;
    (__return_storage_ptr__->prototype).super_gc_heap_ptr_untyped.pos_ = local_50.pos_;
    if ((slot *)local_50.heap_ != (slot *)0x0) {
      gc_heap::attach(local_50.heap_,&(__return_storage_ptr__->prototype).super_gc_heap_ptr_untyped)
      ;
    }
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_a8);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_50);
    return __return_storage_ptr__;
  }
  __assert_fail("prototype.has_type<function_object>()",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/function_object.cpp"
                ,0xc4,
                "global_object_create_result mjs::make_function_object(const gc_heap_ptr<global_object> &)"
               );
}

Assistant:

global_object_create_result make_function_object(const gc_heap_ptr<global_object>& global) {
    auto prototype = global->function_prototype();

    // �15.3.4
    assert(prototype.has_type<function_object>());
    static_cast<function_object&>(*prototype).put_function([](const value&, const std::vector<value>&) {
        return value::undefined;
    }, nullptr, nullptr, 0);

    put_native_function(global, prototype, "toString", [global, prototype](const value& this_, const std::vector<value>&) {
        return value{get_function_object(this_).to_string()};
    }, 0);

    if (global->language_version() >= version::es3) {
        put_native_function(global, prototype, "call", [global](const value& this_, const std::vector<value>& args) {
            std::vector<value> new_args;
            if (args.size() > 1) {
                new_args.insert(new_args.end(), args.cbegin() + 1, args.cend());
            }
            return get_function_object(this_).call(!args.empty() ? args.front() : value::undefined, new_args);
        }, 1);

        put_native_function(global, prototype, "apply", [global](const value& this_, const std::vector<value>& args) {
            auto f = get_function_object_ptr(this_);
            std::vector<value> new_args;

            if (args.size() > 1 && args[1].type() != value_type::undefined && args[1].type() != value_type::null) {
                std::wostringstream woss;
                if (args[1].type() == value_type::object) {
                    auto a = args[1].object_value();
                    auto p = a->prototype();
                    if (global->language_version() >= version::es5
                    || (p && p.get() == global->array_prototype().get()) 
                        || global->is_arguments_array(a)) {
                        const uint32_t len = to_uint32(a->get(L"length"));
                        new_args.resize(len);
                        for (uint32_t i = 0; i < len; ++i) {
                            new_args[i] = a->get(index_string(i));
                        }
                        goto do_call;
                    }
                    woss << a->class_name();
                } else {
                    debug_print(woss, args[1], 4);
                }
                woss << " is not an (arguments) array";
                throw native_error_exception(native_error_type::type, global->stack_trace(), woss.str());
            }
do_call:
            return f->call(!args.empty() ? args.front() : value::undefined, new_args);
        }, 2);
    }

    if (global->language_version() >= version::es5) {
        put_native_function(global, prototype, "bind", [global](const value& this_, const std::vector<value>& args) {
            return value{function_object::bind(get_function_object_ptr(this_), args)};
        }, 1);
    }

    auto obj = make_raw_function(global); // Note: function constructor is added by interpreter
    return { obj, prototype };
}